

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rootindexproxymodel.cpp
# Opt level: O2

bool __thiscall RootIndexProxyModel::hasChildren(RootIndexProxyModel *this,QModelIndex *parent)

{
  RootIndexProxyModelPrivate *pRVar1;
  bool bVar2;
  undefined1 uVar3;
  long lVar4;
  long *plVar5;
  QModelIndex local_30;
  
  lVar4 = QAbstractProxyModel::sourceModel();
  if (lVar4 == 0) {
    uVar3 = 0;
  }
  else {
    pRVar1 = this->m_dptr;
    local_30.r = -1;
    local_30.c = -1;
    local_30.i = 0;
    local_30.m = (QAbstractItemModel *)0x0;
    bVar2 = QModelIndex::isValid(parent);
    if (bVar2) {
      (**(code **)(*(long *)this + 400))(&local_30,this,parent);
    }
    else {
      QPersistentModelIndex::operator_cast_to_QModelIndex(&local_30,&pRVar1->m_rootIndex);
    }
    plVar5 = (long *)QAbstractProxyModel::sourceModel();
    uVar3 = (**(code **)(*plVar5 + 0x88))(plVar5,&local_30);
  }
  return (bool)uVar3;
}

Assistant:

bool RootIndexProxyModel::hasChildren(const QModelIndex &parent) const
{
    Q_ASSERT(!parent.isValid() || parent.model() == this);
    if (!sourceModel())
        return false;
    Q_D(const RootIndexProxyModel);
    QModelIndex sourceParent;
    if (parent.isValid())
        sourceParent = mapToSource(parent);
    else
        sourceParent = d->m_rootIndex;
    return sourceModel()->hasChildren(sourceParent);
}